

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::
BlockImpl_dense<Eigen::Ref<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true,_true>
::BlockImpl_dense(BlockImpl_dense<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true,_true>
                  *this,Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>
                        *xpr,Index i)

{
  MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>,_0>
  ::MapBase((MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>,_0>
             *)this,(xpr->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                    .
                    super_MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                    .m_data + (xpr->
                              super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                              ).m_stride.m_outer.m_value * i,
            (xpr->
            super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value,1);
  this->m_xpr = xpr;
  (this->m_startRow).m_value = 0;
  (this->m_startCol).m_value = i;
  this->m_outerStride =
       (xpr->
       super_RefBase<Eigen::Ref<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).m_stride.m_outer.m_value;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr, Index i)
      : Base(xpr.data() + i * (    ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && (!XprTypeIsRowMajor))
                                || ((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && ( XprTypeIsRowMajor)) ? xpr.innerStride() : xpr.outerStride()),
             BlockRows==1 ? 1 : xpr.rows(),
             BlockCols==1 ? 1 : xpr.cols()),
        m_xpr(xpr),
        m_startRow( (BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) ? i : 0),
        m_startCol( (BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) ? i : 0)
    {
      init();
    }